

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Routing.cpp
# Opt level: O0

void RoutingDemo_GetData(int target,float *data,int numsamples,int numchannels)

{
  int local_34;
  int local_30;
  int i_1;
  int i;
  int n;
  int zerochannels;
  int skipchannels;
  int numchannels_local;
  int numsamples_local;
  float *data_local;
  int target_local;
  
  if ((-1 < target) && (target < 0x10)) {
    n = *(int *)(Routing::bufferchannels + (long)target * 4) - numchannels;
    if (n < 0) {
      n = 0;
    }
    i = numchannels - *(int *)(Routing::bufferchannels + (long)target * 4);
    if (i < 0) {
      i = 0;
    }
    for (i_1 = 0; i_1 < numsamples; i_1 = i_1 + 1) {
      for (local_30 = 0; local_30 < numchannels; local_30 = local_30 + 1) {
        RingBuffer<65536,_float>::Read
                  ((RingBuffer<65536,_float> *)(Routing::buffer + (long)target * 0x40008),
                   data + (i_1 * numchannels + local_30));
      }
      RingBuffer<65536,_float>::Skip
                ((RingBuffer<65536,_float> *)(Routing::buffer + (long)target * 0x40008),n);
      for (local_34 = 0; local_34 < i; local_34 = local_34 + 1) {
        data[(i_1 * numchannels + local_34 + numchannels) - i] = 0.0;
      }
    }
  }
  return;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API void RoutingDemo_GetData(int target, float* data, int numsamples, int numchannels)
{
    if (target < 0 || target >= Routing::MAXINDEX)
        return;
    int skipchannels = Routing::bufferchannels[target] - numchannels; if (skipchannels < 0)
        skipchannels = 0;
    int zerochannels = numchannels - Routing::bufferchannels[target]; if (zerochannels < 0)
        zerochannels = 0;
    for (int n = 0; n < numsamples; n++)
    {
        for (int i = 0; i < numchannels; i++)
            Routing::buffer[target].Read(data[n * numchannels + i]);
        Routing::buffer[target].Skip(skipchannels);
        for (int i = 0; i < zerochannels; i++)
            data[n * numchannels + i + numchannels - zerochannels] = 0.0f;
    }
}